

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture2DView *src,float *texCoord,ReferenceParams *params)

{
  Sampler *sampler;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  byte bVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ConstPixelBufferAccess *levels;
  int iVar16;
  int iVar17;
  uint uVar18;
  float fVar19;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  Texture2DView TVar38;
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DView view;
  float local_1e8 [8];
  float local_1c8 [8];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  undefined1 local_148 [8];
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [40];
  undefined8 uStack_f0;
  long local_e8;
  IVec3 local_d8;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ConstPixelBufferAccess local_a8;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong local_68;
  undefined8 uStack_60;
  Texture2DView local_50;
  IVec3 local_3c;
  
  iVar17 = params->baseLevel;
  iVar12 = src->m_numLevels + -1;
  iVar10 = iVar12;
  if (iVar17 < iVar12) {
    iVar10 = iVar17;
  }
  iVar16 = 0;
  if (-1 < iVar17) {
    iVar16 = iVar10;
  }
  iVar17 = params->maxLevel;
  if (iVar17 < iVar12) {
    iVar12 = iVar17;
  }
  local_50.m_numLevels = 1;
  if (iVar16 <= iVar17) {
    local_50.m_numLevels = (iVar12 - iVar16) + 1;
  }
  local_50.m_levels = src->m_levels + iVar16;
  _local_148 = ZEXT416((uint)*texCoord);
  local_1a8 = ZEXT416((uint)texCoord[1]);
  local_188 = ZEXT416((uint)texCoord[2]);
  local_198 = ZEXT416((uint)texCoord[4]);
  local_138 = ZEXT416((uint)texCoord[6]);
  fVar19 = texCoord[3];
  local_178 = ZEXT416((uint)texCoord[5]);
  local_128 = ZEXT416((uint)texCoord[7]);
  sampler = &params->sampler;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_118._32_8_ = (void *)0x0;
    uStack_f0 = 0;
    local_e8 = 0;
    TVar38 = tcu::getEffectiveTextureView
                       (&local_50,
                        (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)(local_118 + 0x20),sampler);
    uVar9 = TVar38.m_numLevels;
    local_68 = 0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_68 = (ulong)(uint)(params->super_RenderParams).bias;
    }
    uStack_60 = 0;
    if ((int)uVar9 < 1) {
      local_78 = 0.0;
      local_b8 = 0.0;
    }
    else {
      uVar4 = *(undefined8 *)((TVar38.m_levels)->m_size).m_data;
      local_78 = (float)(int)uVar4;
      local_b8 = (float)(int)((ulong)uVar4 >> 0x20);
    }
    local_1c8[0] = (float)local_148._0_4_;
    local_1c8[1] = (float)local_188._0_4_;
    local_1c8[2] = (float)local_198._0_4_;
    local_1c8[3] = (float)local_138._0_4_;
    local_1c8[4] = (float)local_198._0_4_;
    local_1c8[5] = (float)local_188._0_4_;
    local_1e8[0] = (float)local_1a8._0_4_;
    local_1e8[2] = (float)local_178._0_4_;
    local_1e8[3] = (float)local_128._0_4_;
    local_1e8[4] = (float)local_178._0_4_;
    uStack_70 = 0;
    uStack_6c = 0;
    fVar31 = (float)dst->m_width;
    fVar30 = (float)dst->m_height;
    local_1e8[1] = fVar19;
    local_1e8[5] = fVar19;
    fStack_b4 = local_b8;
    fStack_b0 = local_b8;
    fStack_ac = local_b8;
    fStack_74 = local_b8;
    local_148._0_4_ =
         computeLodFromDerivates
                   (params->lodMode,
                    (((float)local_198._0_4_ - (float)local_148._0_4_) * local_78) / fVar31,
                    (((float)local_178._0_4_ - (float)local_1a8._0_4_) * local_b8) / fVar31,
                    (((float)local_188._0_4_ - (float)local_148._0_4_) * local_78) / fVar30,
                    ((fVar19 - (float)local_1a8._0_4_) * local_b8) / fVar30);
    local_148._4_4_ = extraout_XMM0_Db;
    uStack_140 = extraout_XMM0_Dc;
    uStack_13c = extraout_XMM0_Dd;
    local_1a8._0_4_ = params->minLod;
    local_1a8._4_4_ = params->maxLod;
    local_1a8._8_4_ = params->baseLevel;
    local_1a8._12_4_ = params->maxLevel;
    fVar24 = params->maxLod;
    fVar19 = computeLodFromDerivates
                       (params->lodMode,
                        (((float)local_188._0_4_ - (float)local_138._0_4_) * local_78) / fVar31,
                        ((fVar19 - (float)local_128._0_4_) * local_b8) / fVar31,
                        (((float)local_198._0_4_ - (float)local_138._0_4_) * local_78) / fVar30,
                        (((float)local_178._0_4_ - (float)local_128._0_4_) * local_b8) / fVar30);
    auVar23._0_4_ = (float)local_148._0_4_ + (float)local_68;
    auVar23._4_4_ = fVar19 + (float)local_68;
    auVar23._8_4_ = (float)local_148._4_4_ + (float)local_68;
    auVar23._12_4_ = extraout_XMM0_Db_00 + (float)local_68;
    auVar29._4_4_ = params->maxLod;
    auVar29._0_4_ = fVar24;
    auVar29._8_8_ = 0;
    auVar29 = minps(auVar29,auVar23);
    uVar18 = -(uint)(auVar23._4_4_ < params->minLod);
    local_a8.m_size.m_data[2] =
         ~-(uint)(auVar23._0_4_ < (float)local_1a8._0_4_) & auVar29._0_4_ |
         local_1a8._0_4_ & -(uint)(auVar23._0_4_ < (float)local_1a8._0_4_);
    local_a8.m_pitch.m_data[0] = ~uVar18 & auVar29._4_4_ | (uint)params->minLod & uVar18;
    iVar17 = dst->m_height;
    if (0 < iVar17) {
      iVar10 = dst->m_width;
      iVar12 = 0;
      do {
        if (0 < iVar10) {
          iVar17 = 0;
          do {
            auVar22._0_4_ = (float)iVar17 + 0.5;
            auVar22._4_4_ = (float)iVar12 + 0.5;
            auVar22._8_8_ = 0;
            auVar20._0_4_ = (float)iVar10;
            auVar20._4_4_ = (float)dst->m_height;
            auVar20._8_8_ = 0;
            auVar23 = divps(auVar22,auVar20);
            fVar19 = auVar23._4_4_;
            bVar6 = 1.0 <= auVar23._0_4_ + fVar19;
            if (bVar6) {
              auVar23 = ZEXT416((uint)(1.0 - auVar23._0_4_));
              if (bVar6) goto LAB_009f0b3f;
LAB_009f0b56:
              fVar24 = auVar23._0_4_;
            }
            else {
              if (!bVar6) goto LAB_009f0b56;
LAB_009f0b3f:
              fVar24 = auVar23._0_4_;
              fVar19 = 1.0 - fVar19;
            }
            uVar8 = (ulong)bVar6;
            fVar30 = local_1c8[uVar8 * 3];
            fVar31 = (local_1c8[uVar8 * 3 + 1] - fVar30) * fVar19 +
                     (local_1c8[uVar8 * 3 + 2] - fVar30) * fVar24 + fVar30;
            fVar30 = local_1e8[uVar8 * 3];
            fVar24 = (local_1e8[uVar8 * 3 + 1] - fVar30) * fVar19 +
                     (local_1e8[uVar8 * 3 + 2] - fVar30) * fVar24 + fVar30;
            fVar19 = (float)local_a8.m_size.m_data[uVar8 + 2];
            if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
              local_d8.m_data[0] = 0;
              local_d8.m_data[1] = 0;
              local_d8.m_data[2] = 0;
              local_118._0_4_ =
                   tcu::sampleLevelArray2DCompare
                             (TVar38.m_levels,uVar9,sampler,(params->super_RenderParams).ref,fVar31,
                              fVar24,fVar19,&local_d8);
              local_118._4_4_ = SNORM_INT8;
              local_118._8_4_ = 0;
              local_118._12_4_ = 1.0;
            }
            else {
              tcu::sampleLevelArray2D
                        ((ConstPixelBufferAccess *)local_118,(int)TVar38.m_levels,
                         (Sampler *)(ulong)uVar9,fVar31,fVar24,(int)sampler,fVar19);
            }
            fVar19 = (params->super_RenderParams).colorScale.m_data[0] * (float)local_118._0_4_ +
                     (params->super_RenderParams).colorBias.m_data[0];
            fVar24 = (params->super_RenderParams).colorScale.m_data[1] * (float)local_118._4_4_ +
                     (params->super_RenderParams).colorBias.m_data[1];
            fVar30 = (params->super_RenderParams).colorScale.m_data[2] * (float)local_118._8_4_ +
                     (params->super_RenderParams).colorBias.m_data[2];
            fVar31 = (params->super_RenderParams).colorScale.m_data[3] * (float)local_118._12_4_ +
                     (params->super_RenderParams).colorBias.m_data[3];
            bVar5 = dst->m_colorMask;
            uVar11 = 0;
            uVar18 = 0;
            if ((bVar5 & 1) != 0) {
              uVar13 = 0x7e - ((int)fVar19 >> 0x17);
              uVar18 = (((uint)fVar19 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar18 = uVar13;
              }
              uVar18 = uVar18 >> 0x18;
            }
            if ((bVar5 & 2) != 0) {
              uVar13 = 0x7e - ((int)fVar24 >> 0x17);
              uVar11 = (((uint)fVar24 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar11 = uVar13;
              }
              uVar11 = uVar11 >> 0x10 & 0xff00;
            }
            uVar13 = 0;
            if ((bVar5 & 4) != 0) {
              uVar14 = 0x7e - ((int)fVar30 >> 0x17);
              uVar13 = (((uint)fVar30 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                       0x800000;
              if (8 < uVar14) {
                uVar13 = uVar14;
              }
              uVar13 = uVar13 >> 8 & 0xff0000;
            }
            uVar14 = 0xff000000;
            if ((bVar5 & 8) != 0) {
              uVar15 = 0x7e - ((int)fVar31 >> 0x17);
              uVar14 = (((uint)fVar31 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                       0x800000;
              if (8 < uVar15) {
                uVar14 = uVar15;
              }
              uVar14 = uVar14 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)(dst->m_x + iVar17 + (dst->m_y + iVar12) * dst->m_surface->m_width) * 4)
                 = uVar11 | uVar18 | uVar13 | uVar14;
            iVar17 = iVar17 + 1;
            iVar10 = dst->m_width;
          } while (iVar17 < iVar10);
          iVar17 = dst->m_height;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < iVar17);
    }
  }
  else {
    local_118._32_8_ = (void *)0x0;
    uStack_f0 = 0;
    local_e8 = 0;
    TVar38 = tcu::getEffectiveTextureView
                       (&local_50,
                        (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)(local_118 + 0x20),sampler);
    levels = TVar38.m_levels;
    uVar9 = TVar38.m_numLevels;
    local_b8 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_b8 = (params->super_RenderParams).bias;
    }
    iVar17 = dst->m_height;
    if ((int)uVar9 < 1) {
      local_118._0_4_ = (float)local_148._0_4_ * 0.0;
      local_118._4_4_ = (float)local_188._0_4_ * 0.0;
      local_118._8_4_ = (float)local_198._0_4_ * 0.0;
      local_118._12_4_ = (float)local_138._0_4_ * 0.0;
      fVar24 = 0.0;
    }
    else {
      local_118._12_4_ = (undefined4)(levels->m_size).m_data[0];
      local_118._0_4_ = (float)local_118._12_4_ * (float)local_148._0_4_;
      local_118._4_4_ = (float)local_118._12_4_ * (float)local_188._0_4_;
      local_118._8_4_ = (float)local_118._12_4_ * (float)local_198._0_4_;
      local_118._12_4_ = (float)local_118._12_4_ * (float)local_138._0_4_;
      fVar24 = (float)(levels->m_size).m_data[1];
    }
    iVar10 = dst->m_width;
    local_1c8[0] = (float)local_148._0_4_;
    local_1c8[1] = (float)local_188._0_4_;
    local_1c8[2] = (float)local_198._0_4_;
    local_1c8[3] = (float)local_138._0_4_;
    local_1c8[4] = (float)local_198._0_4_;
    local_1c8[5] = (float)local_188._0_4_;
    local_1e8[0] = (float)local_1a8._0_4_;
    local_1e8[1] = fVar19;
    local_1e8[2] = (float)local_178._0_4_;
    local_1e8[3] = (float)local_128._0_4_;
    local_1e8[4] = (float)local_178._0_4_;
    local_1e8[5] = fVar19;
    local_118._16_4_ = local_118._8_4_;
    local_118._20_4_ = local_118._4_4_;
    local_d8.m_data[1] = (int)(fVar24 * fVar19);
    local_d8.m_data[0] = (int)(fVar24 * (float)local_1a8._0_4_);
    local_d8.m_data[2] = (int)(fVar24 * (float)local_178._0_4_);
    fStack_cc = fVar24 * (float)local_128._0_4_;
    local_c8 = fVar24 * (float)local_178._0_4_;
    fStack_c4 = fVar24 * fVar19;
    local_a8.m_pitch.m_data[0] = (int)(params->super_RenderParams).w.m_data[1];
    local_a8.m_pitch.m_data[1] = (int)(params->super_RenderParams).w.m_data[2];
    local_a8.m_size.m_data[2] = (int)(params->super_RenderParams).w.m_data[0];
    local_a8.m_pitch.m_data[2] = (int)(params->super_RenderParams).w.m_data[3];
    local_a8.m_data = (void *)CONCAT44(local_a8.m_pitch.m_data[0],local_a8.m_pitch.m_data[1]);
    if (0 < iVar17) {
      fVar19 = (float)iVar10;
      local_15c = (float)iVar17;
      iVar12 = 0;
      local_14c = fVar19;
      do {
        if (0 < iVar10) {
          local_150 = (float)iVar12 + 0.5;
          fVar24 = local_150 / local_15c;
          local_154 = local_15c - local_150;
          local_158 = 1.0 - fVar24;
          iVar17 = 0;
          do {
            fVar33 = (float)iVar17 + 0.5;
            fVar32 = fVar33 / fVar19;
            bVar6 = 1.0 <= fVar24 + fVar32;
            fVar31 = local_150;
            fVar30 = fVar24;
            if (bVar6) {
              fVar33 = fVar19 - fVar33;
              fVar32 = 1.0 - fVar32;
              fVar31 = local_154;
              fVar30 = local_158;
            }
            uVar8 = (ulong)bVar6;
            lVar7 = uVar8 * 0xc;
            fVar25 = (1.0 - fVar32) - fVar30;
            fVar19 = (float)(&local_a8.m_pitch)[uVar8 - 1].m_data[2];
            fVar1 = (float)(&local_a8.m_pitch)[uVar8].m_data[0];
            fVar2 = (float)(&local_a8.m_pitch)[uVar8].m_data[1];
            fVar26 = fVar32 / fVar2 + fVar30 / fVar1 + fVar25 / fVar19;
            local_188._0_4_ =
                 ((local_1c8[uVar8 * 3 + 2] * fVar32) / fVar2 +
                 (local_1c8[uVar8 * 3 + 1] * fVar30) / fVar1 +
                 (local_1c8[uVar8 * 3] * fVar25) / fVar19) / fVar26;
            fVar35 = (float)iVar10;
            fVar21 = (float)dst->m_height;
            local_198._0_4_ =
                 ((fVar32 * local_1e8[uVar8 * 3 + 2]) / fVar2 +
                 (fVar30 * local_1e8[uVar8 * 3 + 1]) / fVar1 +
                 (fVar25 * local_1e8[uVar8 * 3]) / fVar19) / fVar26;
            fVar27 = fVar31 / fVar21;
            fVar30 = *(float *)(local_118 + lVar7 + 8);
            fVar32 = *(float *)(local_118 + lVar7);
            fVar25 = *(float *)(local_118 + lVar7 + 4);
            local_78 = (float)(&local_d8)[uVar8].m_data[0];
            fVar26 = (float)(&local_d8)[uVar8].m_data[1];
            fVar3 = (float)(&local_d8)[uVar8].m_data[2];
            local_178._0_4_ = fVar2;
            fVar37 = fVar27 + -1.0;
            local_138._0_4_ = fVar37;
            local_68 = CONCAT44(local_68._4_4_,fVar35);
            fVar34 = fVar33 / fVar35;
            local_148._0_4_ = fVar34;
            fVar28 = fVar34 + -1.0;
            local_128._0_4_ = fVar28;
            local_1a8._0_4_ = (fVar30 - fVar32) * fVar1;
            fVar36 = (fVar35 * fVar37 + fVar33) * fVar1 * fVar2 -
                     (fVar2 * fVar35 * fVar27 + fVar1 * fVar33) * fVar19;
            fVar33 = fVar19 * fVar1 * fVar2;
            fVar35 = fVar33 * fVar35;
            fVar36 = fVar36 * fVar36;
            fVar31 = (fVar21 * fVar28 + fVar31) * fVar1 * fVar2 -
                     (fVar1 * fVar21 * fVar34 + fVar31 * fVar2) * fVar19;
            fVar33 = fVar33 * fVar21;
            fVar31 = fVar31 * fVar31;
            fVar19 = computeLodFromDerivates
                               (params->lodMode,
                                (((fVar32 - fVar30) * fVar1 * fVar37 +
                                 ((fVar25 - fVar32) * fVar2 + (fVar30 - fVar25) * fVar19) * fVar27)
                                * fVar35) / fVar36,
                                (((local_78 - fVar3) * fVar1 * fVar37 +
                                 ((fVar26 - local_78) * fVar2 + (fVar3 - fVar26) * fVar19) * fVar27)
                                * fVar35) / fVar36,
                                (((fVar32 - fVar25) * fVar2 * fVar28 +
                                 ((fVar25 - fVar30) * fVar19 + (float)local_1a8._0_4_) * fVar34) *
                                fVar33) / fVar31,
                                (((local_78 - fVar26) * fVar2 * fVar28 +
                                 ((fVar26 - fVar3) * fVar19 + (fVar3 - local_78) * fVar1) * fVar34)
                                * fVar33) / fVar31);
            if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
              local_3c.m_data[0] = 0;
              local_3c.m_data[1] = 0;
              local_3c.m_data[2] = 0;
              local_a8.m_format.order =
                   (ChannelOrder)
                   tcu::sampleLevelArray2DCompare
                             (levels,uVar9,sampler,(params->super_RenderParams).ref,
                              (float)local_188._0_4_,(float)local_198._0_4_,fVar19 + local_b8,
                              &local_3c);
              local_a8.m_format.type = SNORM_INT8;
              local_a8.m_size.m_data[0] = 0;
              local_a8.m_size.m_data[1] = 0x3f800000;
            }
            else {
              tcu::sampleLevelArray2D
                        (&local_a8,(int)TVar38.m_levels,(Sampler *)(ulong)uVar9,
                         (float)local_188._0_4_,(float)local_198._0_4_,(int)sampler,
                         fVar19 + local_b8);
            }
            fVar19 = (params->super_RenderParams).colorScale.m_data[0] *
                     (float)local_a8.m_format.order +
                     (params->super_RenderParams).colorBias.m_data[0];
            fVar30 = (params->super_RenderParams).colorScale.m_data[1] *
                     (float)local_a8.m_format.type +
                     (params->super_RenderParams).colorBias.m_data[1];
            fVar31 = (params->super_RenderParams).colorScale.m_data[2] *
                     (float)local_a8.m_size.m_data[0] +
                     (params->super_RenderParams).colorBias.m_data[2];
            fVar33 = (params->super_RenderParams).colorScale.m_data[3] *
                     (float)local_a8.m_size.m_data[1] +
                     (params->super_RenderParams).colorBias.m_data[3];
            bVar5 = dst->m_colorMask;
            uVar11 = 0;
            uVar18 = 0;
            if ((bVar5 & 1) != 0) {
              uVar13 = 0x7e - ((int)fVar19 >> 0x17);
              uVar18 = (((uint)fVar19 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar18 = uVar13;
              }
              uVar18 = uVar18 >> 0x18;
            }
            if ((bVar5 & 2) != 0) {
              uVar13 = 0x7e - ((int)fVar30 >> 0x17);
              uVar11 = (((uint)fVar30 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                       0x800000;
              if (8 < uVar13) {
                uVar11 = uVar13;
              }
              uVar11 = uVar11 >> 0x10 & 0xff00;
            }
            uVar13 = 0;
            if ((bVar5 & 4) != 0) {
              uVar14 = 0x7e - ((int)fVar31 >> 0x17);
              uVar13 = (((uint)fVar31 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                       0x800000;
              if (8 < uVar14) {
                uVar13 = uVar14;
              }
              uVar13 = uVar13 >> 8 & 0xff0000;
            }
            uVar14 = 0xff000000;
            if ((bVar5 & 8) != 0) {
              uVar15 = 0x7e - ((int)fVar33 >> 0x17);
              uVar14 = (((uint)fVar33 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                       0x800000;
              if (8 < uVar15) {
                uVar14 = uVar15;
              }
              uVar14 = uVar14 & 0xff000000;
            }
            *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                     (long)(dst->m_x + iVar17 + (dst->m_y + iVar12) * dst->m_surface->m_width) * 4)
                 = uVar11 | uVar18 | uVar13 | uVar14;
            iVar17 = iVar17 + 1;
            iVar10 = dst->m_width;
            fVar19 = local_14c;
          } while (iVar17 < iVar10);
          iVar17 = dst->m_height;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < iVar17);
    }
  }
  if ((void *)local_118._32_8_ != (void *)0x0) {
    operator_delete((void *)local_118._32_8_,local_e8 - local_118._32_8_);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture2DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture2DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, tq, params);
	else
		sampleTextureNonProjected(dst, view, sq, tq, params);
}